

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O2

void Kf_ManFree(Kf_Man_t *p)

{
  int *piVar1;
  float *pfVar2;
  word **__ptr;
  word *__ptr_00;
  int i;
  long lVar3;
  
  piVar1 = p->pGia->pRefs;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    p->pGia->pRefs = (int *)0x0;
  }
  piVar1 = (p->vCuts).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCuts).pArray = (int *)0x0;
  }
  piVar1 = (p->vTime).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vTime).pArray = (int *)0x0;
  }
  pfVar2 = (p->vArea).pArray;
  if (pfVar2 != (float *)0x0) {
    free(pfVar2);
    (p->vArea).pArray = (float *)0x0;
  }
  pfVar2 = (p->vRefs).pArray;
  if (pfVar2 != (float *)0x0) {
    free(pfVar2);
    (p->vRefs).pArray = (float *)0x0;
  }
  Vec_IntFreeP(&p->vTemp);
  for (lVar3 = 0; __ptr = (p->pMem).pPages, lVar3 < (p->pMem).nPagesAlloc; lVar3 = lVar3 + 1) {
    __ptr_00 = __ptr[lVar3];
    if (__ptr_00 != (word *)0x0) {
      free(__ptr_00);
      (p->pMem).pPages[lVar3] = (word *)0x0;
    }
  }
  free(__ptr);
  free(p);
  return;
}

Assistant:

void Kf_ManFree( Kf_Man_t * p )
{
    ABC_FREE( p->pGia->pRefs );
    ABC_FREE( p->vCuts.pArray );
    ABC_FREE( p->vTime.pArray );
    ABC_FREE( p->vArea.pArray );
    ABC_FREE( p->vRefs.pArray );
    Vec_IntFreeP( &p->vTemp );
    Vec_SetFree_( &p->pMem );
    ABC_FREE( p );
}